

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::VarStmt::serialize_(VarStmt *this,JSONWriter *w)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar3;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_00;
  ulong uVar4;
  char cVar5;
  string_view name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  name._M_str = "variable";
  name._M_len = 8;
  JSONWriter::key(w,name);
  if (*(__index_type *)
       ((long)&(this->var_).super__Variant_base<hgdb::json::Variable,_unsigned_long>.
               super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
               super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
               super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
               super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
               super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long> + 0x58) == '\0') {
    this_00 = std::get<0ul,hgdb::json::Variable,unsigned_long>(&this->var_);
    Variable::serialize(this_00,w);
    return;
  }
  pvVar3 = std::get<1ul,hgdb::json::Variable,unsigned_long>(&this->var_);
  __val = *pvVar3;
  cVar5 = '\x01';
  if (9 < __val) {
    uVar4 = __val;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (uVar4 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0014c53b;
      }
      if (uVar4 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0014c53b;
      }
      if (uVar4 < 10000) goto LAB_0014c53b;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_0014c53b:
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_40._M_dataplus._M_p,(uint)local_40._M_string_length,__val);
  JSONWriter::value<std::__cxx11::string>(w,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("variable");
        if (var_.index() == 0) {
            std::get<0>(var_).serialize(w);
        } else {
            w.value(std::to_string(std::get<1>(var_)));
        }
    }